

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WriteProjectHeader(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  string_view separator;
  string local_60;
  string local_40;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar1 = std::operator<<(os,"# Project: ");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_40,(cmLocalGenerator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"# Configurations: ");
  separator._M_str = ", ";
  separator._M_len = 2;
  cmJoin(&local_60,&(this->super_cmLocalCommonGenerator).ConfigNames,separator,
         (string_view)ZEXT816(0));
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  cmGlobalNinjaGenerator::WriteDivider(os);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProjectHeader(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Project: " << this->GetProjectName() << '\n'
     << "# Configurations: " << cmJoin(this->GetConfigNames(), ", ") << '\n';
  cmGlobalNinjaGenerator::WriteDivider(os);
}